

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O0

void __thiscall
topk_algorithms::ta_zipf_instance_sample::Entry::Entry(Entry *this,Index r,Index c,Value v)

{
  string local_e0;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Value local_28;
  Value v_local;
  Index c_local;
  Index r_local;
  Entry *this_local;
  
  local_28 = v;
  v_local = c;
  c_local = r;
  r_local = (Index)this;
  std::__cxx11::string::string((string *)this);
  this->row = c_local;
  this->column = v_local;
  this->value = local_28;
  std::__cxx11::to_string(&local_88,this->row);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,":",&local_b9);
  std::operator+(&local_68,&local_88,&local_b8);
  std::__cxx11::to_string(&local_e0,this->column);
  std::operator+(&local_48,&local_68,&local_e0);
  std::__cxx11::string::operator=((string *)this,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

Entry(Index r, Index c, Value v):
                row(r), column(c), value(v)
            {
                key = std::to_string(row) + std::string(":") + std::to_string(column);
            }